

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void yyStackOverflow(yyParser *yypParser)

{
  Parse *pParse_00;
  Parse *pParse;
  yyParser *yypParser_local;
  
  pParse_00 = yypParser->pParse;
  while (yypParser->yystack < yypParser->yytos) {
    yy_pop_parser_stack(yypParser);
  }
  sqlite3ErrorMsg(pParse_00,"parser stack overflow");
  yypParser->pParse = pParse_00;
  return;
}

Assistant:

static void yyStackOverflow(yyParser *yypParser){
   sqlite3ParserARG_FETCH
   sqlite3ParserCTX_FETCH
#ifndef NDEBUG
   if( yyTraceFILE ){
     fprintf(yyTraceFILE,"%sStack Overflow!\n",yyTracePrompt);
   }
#endif
   while( yypParser->yytos>yypParser->yystack ) yy_pop_parser_stack(yypParser);
   /* Here code is inserted which will execute if the parser
   ** stack every overflows */
/******** Begin %stack_overflow code ******************************************/

  sqlite3ErrorMsg(pParse, "parser stack overflow");
/******** End %stack_overflow code ********************************************/
   sqlite3ParserARG_STORE /* Suppress warning about unused %extra_argument var */
   sqlite3ParserCTX_STORE
}